

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall
tf::Executor::_schedule<tf::Node**>(Executor *this,Worker *worker,Node **first,Node **last)

{
  Node *o;
  pointer pBVar1;
  ulong uVar2;
  size_t n;
  size_t sVar3;
  size_t i;
  pthread_mutex_t *__mutex;
  Node *node;
  Node *local_48;
  anon_class_16_2_3fe397bd local_40;
  
  if ((long)last - (long)first != 0) {
    n = (long)last - (long)first >> 3;
    if (worker->_executor != this) {
      for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
        o = first[sVar3];
        pBVar1 = (this->_buffers)._buckets.
                 super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = (ulong)o %
                (ulong)(((long)(this->_buffers)._buckets.
                               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x180);
        __mutex = (pthread_mutex_t *)(pBVar1 + uVar2);
        std::mutex::lock((mutex *)&__mutex->__data);
        UnboundedTaskQueue<tf::Node_*>::push
                  (&(this->_buffers)._buckets.
                    super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar2].queue,o);
        pthread_mutex_unlock(__mutex);
      }
      NonblockingNotifierV2::notify_n(&this->_notifier,n);
      return;
    }
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      local_48 = first[sVar3];
      local_40.this = this;
      local_40.node = &local_48;
      BoundedTaskQueue<tf::Node*,8ul>::
      push<tf::Node*&,tf::Executor::_schedule<tf::Node**>(tf::Worker&,tf::Node**,tf::Node**)::_lambda()_1_>
                ((BoundedTaskQueue<tf::Node*,8ul> *)&worker->_wsq,&local_48,&local_40);
      NonblockingNotifierV2::_notify<false>(&this->_notifier);
    }
  }
  return;
}

Assistant:

void Executor::_schedule(Worker& worker, I first, I last) {

  size_t num_nodes = last - first;
  
  if(num_nodes == 0) {
    return;
  }
  
  // NOTE: We cannot use first/last in the for-loop (e.g., for(; first != last; ++first)).
  // This is because when a node v is inserted into the queue, v can run and finish 
  // immediately. If v is the last node in the graph, it will tear down the parent task vector
  // which cause the last ++first to fail. This problem is specific to MSVC which has a stricter
  // iterator implementation in std::vector than GCC/Clang.
  if(worker._executor == this) {
    for(size_t i=0; i<num_nodes; i++) {
      auto node = detail::get_node_ptr(first[i]);
      worker._wsq.push(node, [&](){ _buffers.push(node); });
      _notifier.notify_one();
    }
    return;
  }
  
  for(size_t i=0; i<num_nodes; i++) {
    _buffers.push(detail::get_node_ptr(first[i]));
  }
  _notifier.notify_n(num_nodes);
}